

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_data.hpp
# Opt level: O2

void __thiscall
duckdb::ArrowAppendData::ArrowAppendData(ArrowAppendData *this,ClientProperties *options_p)

{
  switchD_016d4fed::default(this,0,0xa8);
  ClientProperties::ClientProperties(&this->options,options_p);
  (this->dictionary).release = (_func_void_ArrowArray_ptr *)0x0;
  this->offset = 0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>::resize
            (&(this->arrow_buffers).
              super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>,3);
  return;
}

Assistant:

explicit ArrowAppendData(const ClientProperties &options_p) : options(options_p) {
		dictionary.release = nullptr;
		arrow_buffers.resize(3);
	}